

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

ssize_t __thiscall DomBrush::read(DomBrush *this,int __fd,void *__buf,size_t __nbytes)

{
  QStringView other;
  QStringView other_00;
  QStringView other_01;
  bool bVar1;
  int iVar2;
  int iVar3;
  const_iterator o;
  size_t sVar4;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  DomGradient *v_2;
  DomProperty *v_1;
  DomColor *v;
  QXmlStreamAttribute *attribute;
  QXmlStreamAttributes *__range1;
  QXmlStreamAttributes *attributes;
  QStringView tag;
  QStringView name;
  const_iterator __end1;
  const_iterator __begin1;
  DomProperty *in_stack_fffffffffffffdc8;
  DomProperty *in_stack_fffffffffffffdd0;
  undefined7 in_stack_fffffffffffffdd8;
  byte in_stack_fffffffffffffddf;
  DomProperty *in_stack_fffffffffffffde0;
  undefined7 in_stack_fffffffffffffde8;
  byte in_stack_fffffffffffffdef;
  DomColor *in_stack_fffffffffffffdf0;
  uint in_stack_fffffffffffffdf8;
  const_iterator local_28 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QXmlStreamReader::attributes();
  local_28[0].i = (QXmlStreamAttribute *)0xaaaaaaaaaaaaaaaa;
  local_28[0] = QList<QXmlStreamAttribute>::begin
                          ((QList<QXmlStreamAttribute> *)in_stack_fffffffffffffdd0);
  o = QList<QXmlStreamAttribute>::end((QList<QXmlStreamAttribute> *)in_stack_fffffffffffffdd0);
  while (bVar1 = QList<QXmlStreamAttribute>::const_iterator::operator!=(local_28,o), bVar1) {
    QList<QXmlStreamAttribute>::const_iterator::operator*(local_28);
    QXmlStreamAttribute::name((QXmlStreamAttribute *)0x1b51e5);
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8),
               (size_t)in_stack_fffffffffffffde0);
    QStringView::QStringView<QString,_true>
              ((QStringView *)in_stack_fffffffffffffde0,
               (QString *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
    bVar1 = ::operator==((QStringView *)in_stack_fffffffffffffdd0,
                         (QStringView *)in_stack_fffffffffffffdc8);
    QString::~QString((QString *)0x1b5249);
    if (bVar1) {
      QXmlStreamAttribute::value((QXmlStreamAttribute *)0x1b525d);
      QStringView::toString((QStringView *)in_stack_fffffffffffffdd0);
      setAttributeBrushStyle
                ((DomBrush *)in_stack_fffffffffffffdd0,&in_stack_fffffffffffffdc8->m_attr_name);
      QString::~QString((QString *)0x1b52a1);
    }
    else {
      Qt::Literals::StringLiterals::operator____L1
                ((char *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8),
                 (size_t)in_stack_fffffffffffffdd0);
      ::operator+((QLatin1String *)in_stack_fffffffffffffdd0,
                  (QStringView *)in_stack_fffffffffffffdc8);
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<QLatin1String,_const_QStringView_&> *)in_stack_fffffffffffffdc8);
      QXmlStreamReader::raiseError((QString *)CONCAT44(in_register_00000034,__fd));
      QString::~QString((QString *)0x1b5322);
    }
    QList<QXmlStreamAttribute>::const_iterator::operator++(local_28);
  }
  do {
    while( true ) {
      bVar1 = QXmlStreamReader::hasError((QXmlStreamReader *)0x1b5343);
      if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_001b56a5;
      iVar2 = QXmlStreamReader::readNext();
      if (iVar2 != 4) break;
      QXmlStreamReader::name();
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8),
                 (size_t)in_stack_fffffffffffffde0);
      QStringView::QStringView<QString,_true>
                ((QStringView *)in_stack_fffffffffffffde0,
                 (QString *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
      sVar4 = 0;
      other.m_data._0_4_ = in_stack_fffffffffffffdf8;
      other.m_size = (qsizetype)in_stack_fffffffffffffdf0;
      other.m_data._4_4_ = iVar2;
      iVar3 = QStringView::compare((QStringView *)in_stack_fffffffffffffdc8,other,CaseInsensitive);
      in_stack_fffffffffffffdf8 = CONCAT13(iVar3 != 0,(int3)in_stack_fffffffffffffdf8) ^ 0xff000000;
      QString::~QString((QString *)0x1b541b);
      if ((in_stack_fffffffffffffdf8 & 0x1000000) == 0) {
        Qt::Literals::StringLiterals::operator____s
                  ((char16_t *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8),
                   (size_t)in_stack_fffffffffffffde0);
        QStringView::QStringView<QString,_true>
                  ((QStringView *)in_stack_fffffffffffffde0,
                   (QString *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
        sVar4 = 0;
        other_00.m_data._0_4_ = in_stack_fffffffffffffdf8;
        other_00.m_size = (qsizetype)in_stack_fffffffffffffdf0;
        other_00.m_data._4_4_ = iVar2;
        iVar3 = QStringView::compare
                          ((QStringView *)in_stack_fffffffffffffdc8,other_00,CaseInsensitive);
        in_stack_fffffffffffffdef = iVar3 != 0 ^ 0xff;
        QString::~QString((QString *)0x1b54e3);
        if ((in_stack_fffffffffffffdef & 1) == 0) {
          Qt::Literals::StringLiterals::operator____s
                    ((char16_t *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8),
                     (size_t)in_stack_fffffffffffffde0);
          QStringView::QStringView<QString,_true>
                    ((QStringView *)in_stack_fffffffffffffde0,
                     (QString *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8));
          sVar4 = 0;
          other_01.m_data._0_4_ = in_stack_fffffffffffffdf8;
          other_01.m_size = (qsizetype)in_stack_fffffffffffffdf0;
          other_01.m_data._4_4_ = iVar2;
          iVar2 = QStringView::compare
                            ((QStringView *)in_stack_fffffffffffffdc8,other_01,CaseInsensitive);
          in_stack_fffffffffffffddf = iVar2 != 0 ^ 0xff;
          QString::~QString((QString *)0x1b55ab);
          if ((in_stack_fffffffffffffddf & 1) == 0) {
            in_stack_fffffffffffffdc8 = (DomProperty *)CONCAT44(in_register_00000034,__fd);
            Qt::Literals::StringLiterals::operator____L1
                      ((char *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8),
                       (size_t)in_stack_fffffffffffffdd0);
            ::operator+((QLatin1String *)in_stack_fffffffffffffdd0,
                        (QStringView *)in_stack_fffffffffffffdc8);
            ::QStringBuilder::operator_cast_to_QString
                      ((QStringBuilder<QLatin1String,_const_QStringView_&> *)
                       in_stack_fffffffffffffdc8);
            QXmlStreamReader::raiseError(&in_stack_fffffffffffffdc8->m_attr_name);
            QString::~QString((QString *)0x1b568a);
          }
          else {
            in_stack_fffffffffffffdd0 = (DomProperty *)operator_new(0x118);
            memset(in_stack_fffffffffffffdd0,0,0x118);
            DomGradient::DomGradient((DomGradient *)in_stack_fffffffffffffdd0);
            DomGradient::read((DomGradient *)in_stack_fffffffffffffdd0,__fd,__buf_02,sVar4);
            setElementGradient((DomBrush *)in_stack_fffffffffffffdd0,
                               (DomGradient *)in_stack_fffffffffffffdc8);
          }
        }
        else {
          in_stack_fffffffffffffde0 = (DomProperty *)operator_new(0x178);
          memset(in_stack_fffffffffffffde0,0,0x178);
          DomProperty::DomProperty(in_stack_fffffffffffffdd0);
          DomProperty::read(in_stack_fffffffffffffde0,__fd,__buf_01,sVar4);
          setElementTexture((DomBrush *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
        }
      }
      else {
        in_stack_fffffffffffffdf0 = (DomColor *)operator_new(0x18);
        memset(in_stack_fffffffffffffdf0,0,0x18);
        DomColor::DomColor(in_stack_fffffffffffffdf0);
        DomColor::read(in_stack_fffffffffffffdf0,__fd,__buf_00,sVar4);
        setElementColor((DomBrush *)in_stack_fffffffffffffdd0,(DomColor *)in_stack_fffffffffffffdc8)
        ;
      }
    }
  } while (iVar2 != 5);
LAB_001b56a5:
  QXmlStreamAttributes::~QXmlStreamAttributes((QXmlStreamAttributes *)0x1b56b2);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomBrush::read(QXmlStreamReader &reader)
{
    const QXmlStreamAttributes &attributes = reader.attributes();
    for (const QXmlStreamAttribute &attribute : attributes) {
        const auto name = attribute.name();
        if (name == u"brushstyle"_s) {
            setAttributeBrushStyle(attribute.value().toString());
            continue;
        }
        reader.raiseError("Unexpected attribute "_L1 + name);
    }

    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"color"_s, Qt::CaseInsensitive)) {
                auto *v = new DomColor();
                v->read(reader);
                setElementColor(v);
                continue;
            }
            if (!tag.compare(u"texture"_s, Qt::CaseInsensitive)) {
                auto *v = new DomProperty();
                v->read(reader);
                setElementTexture(v);
                continue;
            }
            if (!tag.compare(u"gradient"_s, Qt::CaseInsensitive)) {
                auto *v = new DomGradient();
                v->read(reader);
                setElementGradient(v);
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}